

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

int asm_lea(ASMState *as,IRIns *ir)

{
  ushort uVar1;
  IRIns *pIVar2;
  Reg RVar3;
  IRIns *pIVar4;
  ushort *in_RSI;
  ASMState *in_RDI;
  Reg base;
  Reg idx_1;
  Reg idx;
  Reg dest;
  RegSet allow;
  IRIns *irr;
  IRIns *irl;
  RegSet in_stack_ffffffffffffffb8;
  IRRef in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  Reg in_stack_ffffffffffffffc4;
  uint8_t local_38;
  
  pIVar2 = in_RDI->ir;
  uVar1 = *in_RSI;
  pIVar4 = in_RDI->ir + in_RSI[1];
  (in_RDI->mrm).idx = 0x80;
  (in_RDI->mrm).base = 0x80;
  (in_RDI->mrm).scale = '\0';
  (in_RDI->mrm).ofs = 0;
  if (((&pIVar2->field_1)[uVar1].r & 0x80) == 0) {
    in_RDI->weakset = (1 << ((&pIVar2->field_1)[uVar1].r & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
    (in_RDI->mrm).base = (&pIVar2->field_1)[uVar1].r;
    if ((in_RSI[1] < 0x8000) || (((pIVar4->field_1).r & 0x80) == 0)) {
      if (((in_RSI[3] & 0x80) == 0) &&
         (((((&pIVar2->field_1)[uVar1].t.irt & 0x40) != 0 &&
           (in_RDI->phireg[(byte)in_RSI[3]] == *in_RSI)) ||
          ((((pIVar4->field_1).t.irt & 0x40) != 0 && (in_RDI->phireg[(byte)in_RSI[3]] == in_RSI[1]))
          )))) {
        return 0;
      }
      if (in_RSI[1] < 0x8000) {
        (in_RDI->mrm).ofs = (pIVar4->field_1).op12;
      }
      else {
        in_RDI->weakset = (1 << ((pIVar4->field_1).r & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
        (in_RDI->mrm).idx = (pIVar4->field_1).r;
      }
    }
    else {
      if ((((pIVar4->field_1).o != ')') || ((uint)in_RSI[1] <= in_RDI->fuseref)) ||
         (0x7fff < (pIVar4->field_0).op2)) {
        return 0;
      }
      RVar3 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      (in_RDI->mrm).idx = (uint8_t)RVar3;
      (in_RDI->mrm).ofs = in_RDI->ir[(pIVar4->field_0).op2].field_1.op12;
    }
  }
  else {
    if ((((*in_RSI == in_RSI[1]) || ((&pIVar2->field_1)[uVar1].o != ')')) ||
        ((uint)*in_RSI <= in_RDI->fuseref)) ||
       ((0x7fff < in_RSI[1] && (0x7fff < (&pIVar2->field_0)[uVar1].op2)))) {
      return 0;
    }
    in_stack_ffffffffffffffc4 =
         ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    (in_RDI->mrm).base = (uint8_t)in_stack_ffffffffffffffc4;
    if (in_RSI[1] < 0x8000) {
      (in_RDI->mrm).ofs = (pIVar4->field_1).op12;
      RVar3 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      local_38 = (uint8_t)RVar3;
    }
    else {
      (in_RDI->mrm).ofs = in_RDI->ir[(&pIVar2->field_0)[uVar1].op2].field_1.op12;
      RVar3 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      local_38 = (uint8_t)RVar3;
    }
    (in_RDI->mrm).idx = local_38;
  }
  RVar3 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  emit_mrm(in_RDI,XO_LEA,RVar3,0x20);
  return 1;
}

Assistant:

static int asm_lea(ASMState *as, IRIns *ir)
{
  IRIns *irl = IR(ir->op1);
  IRIns *irr = IR(ir->op2);
  RegSet allow = RSET_GPR;
  Reg dest;
  as->mrm.base = as->mrm.idx = RID_NONE;
  as->mrm.scale = XM_SCALE1;
  as->mrm.ofs = 0;
  if (ra_hasreg(irl->r)) {
    rset_clear(allow, irl->r);
    ra_noweak(as, irl->r);
    as->mrm.base = irl->r;
    if (irref_isk(ir->op2) || ra_hasreg(irr->r)) {
      /* The PHI renaming logic does a better job in some cases. */
      if (ra_hasreg(ir->r) &&
	  ((irt_isphi(irl->t) && as->phireg[ir->r] == ir->op1) ||
	   (irt_isphi(irr->t) && as->phireg[ir->r] == ir->op2)))
	return 0;
      if (irref_isk(ir->op2)) {
	as->mrm.ofs = irr->i;
      } else {
	rset_clear(allow, irr->r);
	ra_noweak(as, irr->r);
	as->mrm.idx = irr->r;
      }
    } else if (irr->o == IR_ADD && mayfuse(as, ir->op2) &&
	       irref_isk(irr->op2)) {
      Reg idx = ra_alloc1(as, irr->op1, allow);
      rset_clear(allow, idx);
      as->mrm.idx = (uint8_t)idx;
      as->mrm.ofs = IR(irr->op2)->i;
    } else {
      return 0;
    }
  } else if (ir->op1 != ir->op2 && irl->o == IR_ADD && mayfuse(as, ir->op1) &&
	     (irref_isk(ir->op2) || irref_isk(irl->op2))) {
    Reg idx, base = ra_alloc1(as, irl->op1, allow);
    rset_clear(allow, base);
    as->mrm.base = (uint8_t)base;
    if (irref_isk(ir->op2)) {
      as->mrm.ofs = irr->i;
      idx = ra_alloc1(as, irl->op2, allow);
    } else {
      as->mrm.ofs = IR(irl->op2)->i;
      idx = ra_alloc1(as, ir->op2, allow);
    }
    rset_clear(allow, idx);
    as->mrm.idx = (uint8_t)idx;
  } else {
    return 0;
  }
  dest = ra_dest(as, ir, allow);
  emit_mrm(as, XO_LEA, dest, RID_MRM);
  return 1;  /* Success. */
}